

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ticket.c
# Opt level: O2

int mbedtls_ssl_ticket_parse(void *p_ticket,mbedtls_ssl_session *session,uchar *buf,size_t len)

{
  uchar *tag;
  int *piVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  time_t tVar5;
  mbedtls_x509_crt *crt;
  int *piVar6;
  uchar *puVar7;
  ulong uVar8;
  size_t clear_len;
  
  if (((p_ticket != (void *)0x0) && (0x21 < len)) && (*(long *)((long)p_ticket + 200) != 0)) {
    iVar3 = ssl_ticket_update_keys((mbedtls_ssl_ticket_context *)p_ticket);
    if (iVar3 != 0) {
      return iVar3;
    }
    uVar2 = *(ushort *)(buf + 0x10) << 8 | *(ushort *)(buf + 0x10) >> 8;
    uVar8 = (ulong)uVar2;
    if (uVar8 + 0x22 == len) {
      puVar7 = buf + 0x12;
      tag = puVar7 + uVar8;
      lVar4 = 3;
      piVar1 = (int *)p_ticket;
      do {
        piVar6 = piVar1;
        lVar4 = lVar4 + -1;
        if (lVar4 == 0) {
          return -0x6d80;
        }
        piVar1 = piVar6 + 0x18;
      } while (*(int *)buf != *piVar6);
      iVar3 = mbedtls_cipher_auth_decrypt
                        ((mbedtls_cipher_context_t *)(piVar6 + 2),buf + 4,0xc,buf,0x12,puVar7,uVar8,
                         puVar7,&clear_len,tag,0x10);
      if (iVar3 != 0) {
        if (iVar3 != -0x6300) {
          return iVar3;
        }
        return -0x7180;
      }
      if (clear_len != uVar8) {
        return -0x6c00;
      }
      if ((0x97 < uVar2) && (memcpy(session,puVar7,0x98), 0x9a < uVar2)) {
        puVar7 = buf + 0xad;
        uVar8 = (ulong)buf[0xac] | (ulong)((uint)buf[0xab] << 8 | (uint)buf[0xaa] << 0x10);
        if (uVar8 == 0) {
          session->peer_cert = (mbedtls_x509_crt *)0x0;
        }
        else {
          if (tag < puVar7 + uVar8) {
            return -0x7100;
          }
          crt = (mbedtls_x509_crt *)calloc(1,0x228);
          session->peer_cert = crt;
          if (crt == (mbedtls_x509_crt *)0x0) {
            return -0x7f00;
          }
          mbedtls_x509_crt_init(crt);
          iVar3 = mbedtls_x509_crt_parse_der(session->peer_cert,puVar7,uVar8);
          puVar7 = puVar7 + uVar8;
          if (iVar3 != 0) {
            mbedtls_x509_crt_free(session->peer_cert);
            free(session->peer_cert);
            session->peer_cert = (mbedtls_x509_crt *)0x0;
            return iVar3;
          }
        }
        if (puVar7 != tag) {
          return -0x7100;
        }
        tVar5 = time((time_t *)0x0);
        if (session->start <= tVar5) {
          if (*(uint *)((long)p_ticket + 0xc4) < (uint)((int)tVar5 - (int)session->start)) {
            return -0x6d80;
          }
          return 0;
        }
        return -0x6d80;
      }
    }
  }
  return -0x7100;
}

Assistant:

int mbedtls_ssl_ticket_parse( void *p_ticket,
                              mbedtls_ssl_session *session,
                              unsigned char *buf,
                              size_t len )
{
    int ret;
    mbedtls_ssl_ticket_context *ctx = p_ticket;
    mbedtls_ssl_ticket_key *key;
    unsigned char *key_name = buf;
    unsigned char *iv = buf + 4;
    unsigned char *enc_len_p = iv + 12;
    unsigned char *ticket = enc_len_p + 2;
    unsigned char *tag;
    size_t enc_len, clear_len;

    if( ctx == NULL || ctx->f_rng == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    /* See mbedtls_ssl_ticket_write() */
    if( len < 4 + 12 + 2 + 16 )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    if( ( ret = ssl_ticket_update_keys( ctx ) ) != 0 )
        goto cleanup;

    enc_len = ( enc_len_p[0] << 8 ) | enc_len_p[1];
    tag = ticket + enc_len;

    if( len != 4 + 12 + 2 + enc_len + 16 )
    {
        ret = MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
        goto cleanup;
    }

    /* Select key */
    if( ( key = ssl_ticket_select_key( ctx, key_name ) ) == NULL )
    {
        /* We can't know for sure but this is a likely option unless we're
         * under attack - this is only informative anyway */
        ret = MBEDTLS_ERR_SSL_SESSION_TICKET_EXPIRED;
        goto cleanup;
    }

    /* Decrypt and authenticate */
    if( ( ret = mbedtls_cipher_auth_decrypt( &key->ctx, iv, 12,
                    key_name, 4 + 12 + 2, ticket, enc_len,
                    ticket, &clear_len, tag, 16 ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_CIPHER_AUTH_FAILED )
            ret = MBEDTLS_ERR_SSL_INVALID_MAC;

        goto cleanup;
    }
    if( clear_len != enc_len )
    {
        ret = MBEDTLS_ERR_SSL_INTERNAL_ERROR;
        goto cleanup;
    }

    /* Actually load session */
    if( ( ret = ssl_load_session( session, ticket, clear_len ) ) != 0 )
        goto cleanup;

#if defined(MBEDTLS_HAVE_TIME)
    {
        /* Check for expiration */
        mbedtls_time_t current_time = mbedtls_time( NULL );

        if( current_time < session->start ||
            (uint32_t)( current_time - session->start ) > ctx->ticket_lifetime )
        {
            ret = MBEDTLS_ERR_SSL_SESSION_TICKET_EXPIRED;
            goto cleanup;
        }
    }
#endif

cleanup:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}